

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DependenceGraph.h
# Opt level: O0

LLVMNode * __thiscall
dg::DependenceGraph<dg::LLVMNode>::_removeNode
          (DependenceGraph<dg::LLVMNode> *this,KeyT k,ContainerType *cont)

{
  bool bVar1;
  ContainerType *in_RDX;
  iterator *in_RSI;
  DependenceGraph<dg::LLVMNode> *in_RDI;
  iterator it;
  _Self local_30;
  _Self local_28;
  DependenceGraph<dg::LLVMNode> *this_00;
  LLVMNode *local_8;
  
  this_00 = in_RDI;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
       ::find((map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
               *)in_RDI,(key_type *)0x1b23eb);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
       ::end((map<llvm::Value_*,_dg::LLVMNode_*,_std::less<llvm::Value_*>,_std::allocator<std::pair<llvm::Value_*const,_dg::LLVMNode_*>_>_>
              *)in_RDI);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    local_8 = (LLVMNode *)0x0;
  }
  else {
    local_8 = _removeNode(this_00,in_RSI,in_RDX);
  }
  return local_8;
}

Assistant:

NodeT *_removeNode(KeyT k, ContainerType *cont) {
        iterator it = cont->find(k);
        if (it == cont->end())
            return nullptr;

        // remove and re-connect edges
        return _removeNode(it, cont);
    }